

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void simpleexp(LexState *ls,expdesc *v)

{
  int iVar1;
  FuncState *fs;
  expdesc *v_local;
  LexState *ls_local;
  
  iVar1 = (ls->t).token;
  if (iVar1 == 0x7b) {
    constructor(ls,v);
  }
  else {
    if (iVar1 == 0x106) {
      init_exp(v,VFALSE,0);
    }
    else {
      if (iVar1 == 0x108) {
        luaX_next(ls);
        body(ls,v,0,ls->linenumber);
        return;
      }
      if (iVar1 == 0x10d) {
        init_exp(v,VNIL,0);
      }
      else if (iVar1 == 0x113) {
        init_exp(v,VTRUE,0);
      }
      else if (iVar1 == 0x118) {
        if (ls->fs->f->is_vararg == '\0') {
          luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
        }
        iVar1 = luaK_codeABCk(ls->fs,OP_VARARG,0,0,1,0);
        init_exp(v,VVARARG,iVar1);
      }
      else if (iVar1 == 0x121) {
        init_exp(v,VKFLT,0);
        v->u = *(anon_union_8_6_45a55102_for_u *)&(ls->t).seminfo;
      }
      else if (iVar1 == 0x122) {
        init_exp(v,VKINT,0);
        v->u = *(anon_union_8_6_45a55102_for_u *)&(ls->t).seminfo;
      }
      else {
        if (iVar1 != 0x124) {
          suffixedexp(ls,v);
          return;
        }
        codestring(v,(ls->t).seminfo.ts);
      }
    }
    luaX_next(ls);
  }
  return;
}

Assistant:

static void simpleexp (LexState *ls, expdesc *v) {
  /* simpleexp -> FLT | INT | STRING | NIL | TRUE | FALSE | ... |
                  constructor | FUNCTION body | suffixedexp */
  switch (ls->t.token) {
    case TK_FLT: {
      init_exp(v, VKFLT, 0);
      v->u.nval = ls->t.seminfo.r;
      break;
    }
    case TK_INT: {
      init_exp(v, VKINT, 0);
      v->u.ival = ls->t.seminfo.i;
      break;
    }
    case TK_STRING: {
      codestring(v, ls->t.seminfo.ts);
      break;
    }
    case TK_NIL: {
      init_exp(v, VNIL, 0);
      break;
    }
    case TK_TRUE: {
      init_exp(v, VTRUE, 0);
      break;
    }
    case TK_FALSE: {
      init_exp(v, VFALSE, 0);
      break;
    }
    case TK_DOTS: {  /* vararg */
      FuncState *fs = ls->fs;
      check_condition(ls, fs->f->is_vararg,
                      "cannot use '...' outside a vararg function");
      init_exp(v, VVARARG, luaK_codeABC(fs, OP_VARARG, 0, 0, 1));
      break;
    }
    case '{': {  /* constructor */
      constructor(ls, v);
      return;
    }
    case TK_FUNCTION: {
      luaX_next(ls);
      body(ls, v, 0, ls->linenumber);
      return;
    }
    default: {
      suffixedexp(ls, v);
      return;
    }
  }
  luaX_next(ls);
}